

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

void pack_names(void)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  bucket *pbVar4;
  char *pcVar5;
  size_t __size;
  long lVar6;
  
  if (first_symbol == (bucket *)0x0) {
    __size = 0xd;
  }
  else {
    __size = 0xd;
    pbVar4 = first_symbol;
    do {
      sVar3 = strlen(pbVar4->name);
      __size = (size_t)((int)__size + (int)sVar3 + 1);
      pbVar4 = pbVar4->next;
    } while (pbVar4 != (bucket *)0x0);
  }
  name_pool = (char *)malloc(__size);
  if (name_pool == (char *)0x0) {
    no_space();
  }
  pcVar5 = name_pool;
  builtin_strncpy(name_pool,"$accept",8);
  builtin_strncpy(pcVar5 + 8,"$end",5);
  if (first_symbol != (bucket *)0x0) {
    pcVar5 = pcVar5 + 0xd;
    pbVar4 = first_symbol;
    do {
      pcVar2 = pbVar4->name;
      lVar6 = 0;
      do {
        cVar1 = pcVar2[lVar6];
        pcVar5[lVar6] = cVar1;
        lVar6 = lVar6 + 1;
      } while (cVar1 != '\0');
      free(pbVar4->name);
      pbVar4->name = pcVar5;
      pbVar4 = pbVar4->next;
      pcVar5 = pcVar5 + lVar6;
    } while (pbVar4 != (bucket *)0x0);
  }
  return;
}

Assistant:

void pack_names()
{
    register bucket *bp;
    register char *p, *s, *t;

    name_pool_size = 13;  /* 13 == sizeof("$end") + sizeof("$accept") */
    for (bp = first_symbol; bp; bp = bp->next)
	name_pool_size += strlen(bp->name) + 1;
    name_pool = MALLOC(name_pool_size);
    if (name_pool == 0) no_space();

    strcpy(name_pool, "$accept");
    strcpy(name_pool+8, "$end");
    t = name_pool + 13;
    for (bp = first_symbol; bp; bp = bp->next) {
	p = t;
	s = bp->name;
	while ((*t++ = *s++)) continue;
	FREE(bp->name);
	bp->name = p; }
}